

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O3

void rw::xbox::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  ushort uVar1;
  Geometry *pGVar2;
  uint32 uVar3;
  InstanceDataHeader *pIVar4;
  undefined8 uVar5;
  uint32 *minVert;
  long lVar6;
  MeshHeader *pMVar7;
  void *__dest;
  uint uVar8;
  
  pGVar2 = atomic->geometry;
  if (pGVar2->instData == (InstanceDataHeader *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 205"
    ;
    pIVar4 = (InstanceDataHeader *)(*DAT_00149de8)(0x40,0x3000f);
    pMVar7 = pGVar2->meshHeader;
    pGVar2->instData = pIVar4;
    pIVar4->platform = 5;
    uVar1 = pMVar7->numMeshes;
    uVar3 = ((uint)uVar1 + (uint)uVar1 * 2) * 8 + 0x34;
    pIVar4[1].platform = uVar3;
    if (uVar1 != 0) {
      lVar6 = 0;
      do {
        uVar3 = uVar3 + (*(int *)((long)&pMVar7[1].totalIndices + lVar6) * 2 + 0xfU & 0xfffffff0);
        lVar6 = lVar6 + 0x18;
      } while ((uint)uVar1 * 0x18 != (int)lVar6);
      pIVar4[1].platform = uVar3;
    }
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 216"
    ;
    uVar5 = (*DAT_00149de8)((long)(int)(uVar3 + 0x18),0x3000f);
    *(undefined8 *)(pIVar4 + 0xe) = uVar5;
    *(uint16 *)&pIVar4[2].platform = pMVar7->serialNum;
    uVar1 = pMVar7->numMeshes;
    *(ushort *)((long)&pIVar4[2].platform + 2) = uVar1;
    pIVar4[3].platform = (pMVar7->flags == 1) + 5;
    pIVar4[4].platform = pGVar2->numVertices;
    *(undefined8 *)(pIVar4 + 5) = 0;
    *(undefined8 *)(pIVar4 + 7) = 0;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 227"
    ;
    minVert = (uint32 *)(*DAT_00149de8)((ulong)uVar1 * 0x28,0x3000f);
    *(uint32 **)(pIVar4 + 10) = minVert;
    uVar1 = *(ushort *)((long)&pIVar4[2].platform + 2);
    if (uVar1 != 0) {
      pMVar7 = pMVar7 + 1;
      __dest = (void *)((ulong)(((uint)uVar1 + (uint)uVar1 * 2) * 8 + 0x4b & 0xfffffff0) +
                       *(long *)(pIVar4 + 0xe));
      uVar8 = 0;
      do {
        findMinVertAndNumVertices
                  (*(uint16 **)pMVar7,pMVar7->totalIndices,minVert,(int32 *)(minVert + 1));
        uVar3 = pMVar7->totalIndices;
        minVert[2] = uVar3;
        *(void **)(minVert + 4) = __dest;
        memcpy(__dest,*(void **)pMVar7,(long)(int)uVar3 * 2);
        __dest = (void *)((long)__dest + ((long)(int)minVert[2] * 2 + 0xfU & 0xfffffffffffffff0));
        *(undefined8 *)(minVert + 6) = *(undefined8 *)(pMVar7 + 1);
        minVert[8] = 0;
        pMVar7 = (MeshHeader *)&pMVar7[1].totalIndices;
        minVert = minVert + 10;
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(ushort *)((long)&pIVar4[2].platform + 2));
    }
    *(uint32 **)(pIVar4 + 0xc) = minVert;
    (**(code **)&rwpipe[1].super_Pipeline)(pGVar2,pIVar4);
    return;
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE (or not, xbox can't render)
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	MeshHeader *meshh = geo->meshHeader;
	geo->instData = header;
	header->platform = PLATFORM_XBOX;

	header->size = 0x24 + meshh->numMeshes*0x18 + 0x10;
	Mesh *mesh = meshh->getMeshes();
	for(uint32 i = 0; i < meshh->numMeshes; i++)
		header->size += (mesh++->numIndices*2 + 0xF) & ~0xF;
	// The 0x18 byte are the resentryheader.
	// We don't have it but it's used for alignment.
	header->data = rwNewT(uint8, header->size + 0x18, MEMDUR_EVENT | ID_GEOMETRY);
	header->serialNumber = meshh->serialNum;
	header->numMeshes = meshh->numMeshes;
	header->primType = meshh->flags == MeshHeader::TRISTRIP ?
		D3DPT_TRIANGLESTRIP : D3DPT_TRIANGLELIST;
	header->numVertices = geo->numVertices;
	header->vertexAlpha = 0;
	// set by the instanceCB
	header->stride = 0;
	header->vertexBuffer = nil;

	InstanceData *inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);
	header->begin = inst;
	mesh = meshh->getMeshes();
	uint8 *indexbuf = (uint8*)header->data + ((0x18 + 0x24 + header->numMeshes*0x18 + 0xF)&~0xF);
	for(uint32 i = 0; i < header->numMeshes; i++){
		findMinVertAndNumVertices(mesh->indices, mesh->numIndices,
		                          &inst->minVert, &inst->numVertices);
		inst->numIndices = mesh->numIndices;
		inst->indexBuffer = indexbuf;
		memcpy(inst->indexBuffer, mesh->indices, inst->numIndices*sizeof(uint16));
		indexbuf += (inst->numIndices*2 + 0xF) & ~0xF;
		inst->material = mesh->material;
		inst->vertexShader = 0;	// TODO?
		mesh++;
		inst++;
	}
	header->end = inst;

	pipe->instanceCB(geo, header);
}